

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::TrigramAlphabet::MegaMatch(TrigramAlphabet *this,char16 *input,int inputLen)

{
  byte bVar1;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  bool bVar8;
  uint uVar9;
  char16 *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  byte bVar2;
  
  this->input = input;
  this->inputLen = inputLen;
  if ((7 < inputLen) && (inputLen != 8)) {
    pcVar10 = input + 2;
    uVar13 = 3;
    lVar12 = 0x300000000;
    bVar3 = this->alphaBits[(ushort)input[1] & 0x5f];
    bVar1 = this->alphaBits[(ushort)*input & 0x5f];
    do {
      bVar2 = bVar3;
      bVar3 = this->alphaBits[(ushort)*pcVar10 & 0x5f];
      lVar11 = (ulong)((uint)bVar1 * 0x40 + (uint)bVar2 * 8) + (ulong)bVar3;
      if (((uint)lVar11 < 0xdd) && (lVar11 = (long)this->trigramMap[lVar11], lVar11 != 0x41)) {
        uVar5 = this->trigramStarts[lVar11].count;
        if (0 < (int)uVar5) {
          bVar8 = true;
          lVar14 = lVar12;
          uVar15 = 0;
          uVar9 = 0;
          do {
            uVar4 = *(ushort *)((long)input + (lVar14 >> 0x1f));
            if (0x7f < uVar4) {
              bVar8 = false;
              uVar16 = uVar9;
              break;
            }
            uVar16 = (1 << (this->alphaBits[uVar4 & 0x5f] & 0x1fU)) + uVar9 * 0x10;
            if (this->alphaBits[uVar4 & 0x5f] == 4) {
              bVar8 = false;
              uVar16 = uVar9;
              break;
            }
            lVar14 = lVar14 + 0x100000000;
            bVar17 = uVar15 < 4;
            uVar15 = uVar15 + 1;
            uVar9 = uVar16;
          } while (bVar17);
          if (bVar8) {
            if ((int)uVar5 < 2) {
              uVar5 = 1;
            }
            lVar14 = 0;
            do {
              if ((uVar16 & ~*(uint *)((long)&this->trigramStarts[lVar11].patterns[0].encodedPattern
                                      + lVar14)) == 0) {
                puVar7 = *(undefined1 **)
                          (*(long *)((long)&this->trigramStarts[lVar11].patterns[0].pattern + lVar14
                                    ) + 0x30);
                iVar6 = *(int *)(puVar7 + 0xc);
                if ((long)iVar6 < 0x20) {
                  *(int *)(puVar7 + 0xc) = iVar6 + 1;
                  *(int *)(puVar7 + (long)iVar6 * 4 + 0x10) = (int)uVar13 + -3;
                }
                else {
                  *puVar7 = 0;
                }
              }
              lVar14 = lVar14 + 0x10;
            } while ((ulong)uVar5 * 0x10 != lVar14);
          }
        }
      }
      pcVar10 = input + uVar13;
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x100000000;
      bVar1 = bVar2;
    } while (uVar13 != inputLen - 5);
  }
  return;
}

Assistant:

void TrigramAlphabet::MegaMatch(__in_ecount(inputLen) const char16* input,int inputLen) {
        this->input=input;
        this->inputLen=inputLen;
        if (inputLen<TrigramInfo::PatternLength) {
            return;
        }
        // prime the pump
        unsigned char c1=alphaBits[input[0]&UpperCaseMask];
        unsigned char c2=alphaBits[input[1]&UpperCaseMask];
        unsigned char c3=alphaBits[input[2]&UpperCaseMask];
        // pump
        for (int k=3;k<inputLen-5;k++) {
            int index=(c1<<6)+(c2<<3)+c3;
            if (index<TrigramMapSize) {
                int t=trigramMap[index];
                if (t!=TrigramNotInPattern) {
                    int count=trigramStarts[t].count;
                    if (count>0) {
                        int inputMask=0;
                        bool validInput=true;
                        for (int j=0;j<5;j++) {
                            // ascii check
                            if (input[k+j]<128) {
                                int bits=alphaBits[input[k+j]&UpperCaseMask];
                                if (bits==BitsNotInAlpha) {
                                    validInput=false;
                                    break;
                                }
                                inputMask=(inputMask<<AlphaCount)+(1<<bits);
                            }
                            else {
                                validInput=false;
                                break;
                            }
                        }
                        if (validInput) {
                            for (int j=0;j<count;j++) {
                                PatternTri* tri= &(trigramStarts[t].patterns[j]);
                                if ((inputMask&(tri->encodedPattern))==inputMask) {
                                    if (tri->pattern->rep.unified.trigramInfo->resultCount<TrigramInfo::MaxResults) {
                                        tri->pattern->rep.unified.trigramInfo->offsets[tri->pattern->rep.unified.trigramInfo->resultCount++]=k-3;
                                    }
                                    else {
                                        tri->pattern->rep.unified.trigramInfo->isTrigramPattern=false;
                                    }
                                }
                            }
                        }
                    }
                }
            }
            c1=c2;
            c2=c3;
            c3=alphaBits[input[k]&UpperCaseMask];
        }
    }